

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Extractor::extract(Extractor *this,int blob_index,Mat *feat,int type)

{
  long lVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  const_reference pvVar5;
  int in_ECX;
  Mat *in_RDX;
  int in_ESI;
  long in_RDI;
  void *in_R8;
  undefined8 in_R9;
  Mat feat_fp32_1;
  Mat feat_fp32;
  Mat bottom_blob_unpacked;
  int layer_index;
  int ret;
  int old_flush_denormals;
  int old_blocktime;
  Mat *in_stack_fffffffffffffe70;
  Mat *in_stack_fffffffffffffe78;
  Option *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  Mat *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  NetPrivate *in_stack_fffffffffffffeb8;
  Mat local_120;
  Mat local_d8;
  Mat local_80;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Mat *local_20;
  int local_14;
  int local_4;
  
  if ((in_ESI < 0) ||
     (local_24 = in_ECX, local_20 = in_RDX, local_14 = in_ESI,
     sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(*(long *)(in_RDI + 8) + 8)
                       ), (int)sVar3 <= in_ESI)) {
    local_4 = -1;
  }
  else {
    local_28 = get_kmp_blocktime();
    set_kmp_blocktime(*(int *)(*(long *)(in_RDI + 8) + 0x38));
    local_2c = get_flush_denormals();
    set_flush_denormals(0x163262);
    local_30 = 0;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(*(long *)(in_RDI + 8) + 8)
                        ,(long)local_14);
    if (pvVar4->dims == 0) {
      this_00 = Net::blobs((Net *)**(undefined8 **)(in_RDI + 8));
      pvVar5 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                         (this_00,(long)local_14);
      local_34 = pvVar5->producer;
      if ((*(byte *)(*(long *)(in_RDI + 8) + 0x54) & 1) != 0) {
        if (*(long *)(*(long *)(in_RDI + 8) + 0x28) == 0) {
          *(undefined8 *)(*(long *)(in_RDI + 8) + 0x28) =
               *(undefined8 *)(*(long *)(**(long **)(in_RDI + 8) + 0x48) + 0xb0);
        }
        if (*(long *)(*(long *)(in_RDI + 8) + 0x30) == 0) {
          *(undefined8 *)(*(long *)(in_RDI + 8) + 0x30) =
               *(undefined8 *)(*(long *)(**(long **)(in_RDI + 8) + 0x48) + 0xb8);
        }
      }
      local_30 = NetPrivate::forward_layer
                           (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                            (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                            in_stack_fffffffffffffea8,
                            (Option *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0))
      ;
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(*(long *)(in_RDI + 8) + 8),
               (long)local_14);
    ncnn::Mat::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    if ((((*(byte *)(*(long *)(in_RDI + 8) + 0x47) & 1) != 0) && (local_24 == 0)) &&
       (local_20->elempack != 1)) {
      ncnn::Mat::Mat(&local_80);
      convert_packing((Mat *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,in_stack_fffffffffffffe98)
      ;
      ncnn::Mat::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      ncnn::Mat::~Mat((Mat *)0x16341a);
    }
    if (((*(byte *)(*(long *)(in_RDI + 8) + 0x40) & 1) == 0) || (local_24 != 0)) {
      iVar2 = ncnn::Mat::elembits(local_20);
      if ((iVar2 == 8) && (local_24 == 0)) {
        in_stack_fffffffffffffe70 = &local_120;
        ncnn::Mat::Mat(in_stack_fffffffffffffe70);
        cast_int8_to_float32
                  ((Mat *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffea8,
                   (Option *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        ncnn::Mat::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
        ncnn::Mat::~Mat((Mat *)0x163563);
      }
    }
    else {
      iVar2 = ncnn::Mat::elembits(local_20);
      if (iVar2 == 0x10) {
        in_stack_fffffffffffffe78 = &local_d8;
        ncnn::Mat::Mat(in_stack_fffffffffffffe78);
        cast_bfloat16_to_float32
                  ((Mat *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffea8,
                   (Option *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        ncnn::Mat::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
        ncnn::Mat::~Mat((Mat *)0x1634cc);
      }
    }
    if (((*(byte *)(*(long *)(in_RDI + 8) + 0x54) & 1) != 0) &&
       (lVar1 = *(long *)(**(long **)(in_RDI + 8) + 0x48),
       local_20->allocator == *(Allocator **)(lVar1 + 0xb0))) {
      ncnn::Mat::clone((Mat *)&stack0xfffffffffffffe98,(__fn *)local_20,(void *)0x0,(int)lVar1,in_R8
                       ,in_R9,(Mat *)&stack0xfffffffffffffe98);
      ncnn::Mat::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      ncnn::Mat::~Mat((Mat *)0x1635f5);
    }
    set_kmp_blocktime(local_28);
    set_flush_denormals(0x16362f);
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

int Extractor::extract(int blob_index, Mat& feat, int type)
{
    if (blob_index < 0 || blob_index >= (int)d->blob_mats.size())
        return -1;

    int old_blocktime = get_kmp_blocktime();
    set_kmp_blocktime(d->opt.openmp_blocktime);

    int old_flush_denormals = get_flush_denormals();
    set_flush_denormals(d->opt.flush_denormals);

    int ret = 0;

    if (d->blob_mats[blob_index].dims == 0)
    {
        int layer_index = d->net->blobs()[blob_index].producer;

        // use local allocator
        if (d->opt.use_local_pool_allocator)
        {
            if (!d->opt.blob_allocator)
            {
                d->opt.blob_allocator = d->net->d->local_blob_allocator;
            }
            if (!d->opt.workspace_allocator)
            {
                d->opt.workspace_allocator = d->net->d->local_workspace_allocator;
            }
        }

#if NCNN_VULKAN
        if (d->opt.use_vulkan_compute)
        {
            // use local allocator
            if (!d->opt.blob_vkallocator)
            {
                d->local_blob_vkallocator = d->net->vulkan_device()->acquire_blob_allocator();
                d->opt.blob_vkallocator = d->local_blob_vkallocator;
            }
            if (!d->opt.workspace_vkallocator)
            {
                d->opt.workspace_vkallocator = d->opt.blob_vkallocator;
            }
            if (!d->opt.staging_vkallocator)
            {
                d->local_staging_vkallocator = d->net->vulkan_device()->acquire_staging_allocator();
                d->opt.staging_vkallocator = d->local_staging_vkallocator;
            }

            ncnn::VkCompute cmd(d->net->vulkan_device());
#if NCNN_BENCHMARK
            cmd.create_query_pool(d->net->layers().size() * 2);
#endif // NCNN_BENCHMARK

            // TODO vkimagemat for adreno
            if (d->opt.use_image_storage)
            {
                VkImageMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (d->blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, d->blob_mats[blob_index], d->opt);

                    cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(d->net->layers().size() * 2);
                    cmd.get_query_pool_results(0, d->net->layers().size() * 2, results);
                    for (size_t i = 0; i < d->net->layers().size(); i++)
                    {
                        uint64_t start = results[i * 2];
                        uint64_t end = results[i * 2 + 1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * d->net->vulkan_device()->info.timestamp_period() / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", d->net->layers()[i]->type.c_str(), d->net->layers()[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
            else
            {
                VkMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (d->blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, d->blob_mats[blob_index], d->opt);

                    cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(d->net->layers().size() * 2);
                    cmd.get_query_pool_results(0, d->net->layers().size() * 2, results);
                    for (size_t i = 0; i < d->net->layers().size(); i++)
                    {
                        uint64_t start = results[i * 2];
                        uint64_t end = results[i * 2 + 1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * d->net->vulkan_device()->info.timestamp_period() / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", d->net->layers()[i]->type.c_str(), d->net->layers()[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
        }
        else
        {
            ret = d->net->d->forward_layer(layer_index, d->blob_mats, d->opt);
        }
#else
        ret = d->net->d->forward_layer(layer_index, d->blob_mats, d->opt);
#endif // NCNN_VULKAN
    }

    feat = d->blob_mats[blob_index];

    if (d->opt.use_packing_layout && (type == 0) && feat.elempack != 1)
    {
        Mat bottom_blob_unpacked;
        convert_packing(feat, bottom_blob_unpacked, 1, d->opt);
        feat = bottom_blob_unpacked;
    }

    // clang-format off
    // *INDENT-OFF*
#if NCNN_ARM82
    if (d->opt.use_fp16_storage && cpu_support_arm_asimdhp() && (type == 0))
    {
        if (feat.elembits() == 16)
        {
            Mat feat_fp32;
            cast_float16_to_float32(feat, feat_fp32, d->opt);
            feat = feat_fp32;
        }
    }
    else
#endif // NCNN_ARM82
#if NCNN_BF16
    if (d->opt.use_bf16_storage && (type == 0))
    {
        if (feat.elembits() == 16)
        {
            Mat feat_fp32;
            cast_bfloat16_to_float32(feat, feat_fp32, d->opt);
            feat = feat_fp32;
        }
    }
    else
#endif // NCNN_BF16
    if (feat.elembits() == 8 && (type == 0))
    {
        Mat feat_fp32;
        cast_int8_to_float32(feat, feat_fp32, d->opt);
        feat = feat_fp32;
    }
    // *INDENT-ON*
    // clang-format on

    if (d->opt.use_local_pool_allocator && feat.allocator == d->net->d->local_blob_allocator)
    {
        // detach the returned mat from local pool allocator
        // so we could destroy net instance much earlier
        feat = feat.clone();
    }

    set_kmp_blocktime(old_blocktime);
    set_flush_denormals(old_flush_denormals);

    return ret;
}